

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::emit_specialization_constants_and_structs(CompilerMSL *this)

{
  bool bVar1;
  uint32_t uVar2;
  Types TVar3;
  uint32_t uVar4;
  SPIRConstant *c_00;
  SPIRType *pSVar5;
  size_type sVar6;
  TypedID *pTVar7;
  SPIRType *pSVar8;
  string *ts_1;
  SPIRConstantOp *pSVar9;
  size_type sVar10;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar11;
  bool local_56b;
  bool local_569;
  bool local_567;
  byte local_565;
  allocator local_439;
  string local_438;
  string local_418 [32];
  string local_3f8;
  string local_3d8;
  undefined4 local_3b4;
  SPIRType *local_3b0;
  SPIRType *type_3;
  SPIRUndef *undef;
  undefined1 local_398;
  uint32_t local_38c;
  uint32_t local_388;
  byte local_382;
  bool local_381;
  uint32_t local_380;
  bool is_declarable_struct;
  ID IStack_37c;
  bool is_builtin_block;
  bool local_376;
  byte local_375;
  uint32_t local_374;
  bool is_block;
  bool is_struct;
  SPIRType *pSStack_370;
  TypeID type_id;
  SPIRType *type_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  string local_328 [8];
  string name;
  SPIRType *type_1;
  SPIRConstantOp *c_1;
  string local_2d8;
  uint32_t local_2b4;
  string local_2b0;
  uint32_t local_28c;
  string local_288;
  string local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  string sc_tmp_name;
  BaseType sc_tmp_type;
  pair<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)0>_> local_1ec;
  uint32_t local_1e4;
  uint32_t local_1e0;
  uint32_t local_1dc;
  uint32_t constant_id;
  string sc_name;
  string sc_type_name;
  SPIRType *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  SPIRConstant *local_150;
  SPIRConstant *c;
  Variant *id;
  TypedID<(spirv_cross::Types)0> *id_;
  TypedID<(spirv_cross::Types)0> *__end1;
  TypedID<(spirv_cross::Types)0> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range1;
  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
  unique_func_constants;
  undefined1 local_d0 [8];
  LoopLock loop_lock;
  bool builtin_block_type_is_required;
  anon_class_8_1_8991fb9c local_a8;
  undefined1 local_a0 [8];
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  aligned_structs;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  declared_structs;
  bool emitted;
  ID workgroup_size_id;
  SpecializationConstant wg_z;
  SpecializationConstant wg_y;
  SpecializationConstant wg_x;
  CompilerMSL *this_local;
  
  SpecializationConstant::SpecializationConstant(&wg_y);
  SpecializationConstant::SpecializationConstant(&wg_z);
  SpecializationConstant::SpecializationConstant((SpecializationConstant *)&stack0xffffffffffffffd8)
  ;
  uVar2 = Compiler::get_work_group_size_specialization_constants
                    ((Compiler *)this,&wg_y,&wg_z,(SpecializationConstant *)&stack0xffffffffffffffd8
                    );
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)((long)&declared_structs._M_h._M_single_bucket + 4),
             uVar2);
  declared_structs._M_h._M_single_bucket._3_1_ = 0;
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&aligned_structs._M_h._M_single_bucket);
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_a0);
  local_a8.this = this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRType,spirv_cross::CompilerMSL::emit_specialization_constants_and_structs()::__0>
            (&(this->super_CompilerGLSL).super_Compiler.ir,&local_a8);
  loop_lock.lock = (uint32_t *)this;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRConstant,spirv_cross::CompilerMSL::emit_specialization_constants_and_structs()::__1>
            (&(this->super_CompilerGLSL).super_Compiler.ir,(anon_class_16_2_94938598 *)&loop_lock);
  ParsedIR::create_loop_soft_lock((ParsedIR *)local_d0);
  unique_func_constants._M_h._M_single_bucket =
       (__node_base_ptr)&aligned_structs._M_h._M_single_bucket;
  ParsedIR::
  for_each_typed_id<spirv_cross::SPIRType,spirv_cross::CompilerMSL::emit_specialization_constants_and_structs()::__2>
            (&(this->super_CompilerGLSL).super_Compiler.ir,
             (anon_class_24_3_139e5662 *)&unique_func_constants._M_h._M_single_bucket);
  if ((declared_structs._M_h._M_single_bucket._3_1_ & 1) != 0) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x48ca95);
  }
  declared_structs._M_h._M_single_bucket._3_1_ = 0;
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           *)&aligned_structs._M_h._M_single_bucket);
  ::std::
  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
  ::unordered_map((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                   *)&__range1);
  __begin1 = (TypedID<(spirv_cross::Types)0> *)
             &(this->super_CompilerGLSL).super_Compiler.ir.ids_for_constant_undef_or_type;
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1);
  id_ = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                  ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_> *)__begin1);
  do {
    if (__end1 == id_) {
      if ((declared_structs._M_h._M_single_bucket._3_1_ & 1) != 0) {
        CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x48ca95);
      }
      local_3b4 = 0;
LAB_00271ce9:
      ::std::
      unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
      ::~unordered_map((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                        *)&__range1);
      ParsedIR::LoopLock::~LoopLock((LoopLock *)local_d0);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)local_a0);
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&aligned_structs._M_h._M_single_bucket);
      return;
    }
    id = (Variant *)__end1;
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    c = (SPIRConstant *)
        VectorView<spirv_cross::Variant>::operator[]
                  (&(this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>,(ulong)uVar2);
    TVar3 = Variant::get_type((Variant *)c);
    if (TVar3 == TypeConstant) {
      local_150 = Variant::get<spirv_cross::SPIRConstant>((Variant *)c);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_150->super_IVariant).self);
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)((long)&declared_structs._M_h._M_single_bucket + 4));
      if (uVar2 == uVar4) {
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(&local_170,this,0x19,4);
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((long)&declared_structs._M_h._M_single_bucket + 4));
        c_00 = Compiler::get<spirv_cross::SPIRConstant>((Compiler *)this,uVar2);
        CompilerGLSL::constant_expression_abi_cxx11_
                  ((string *)&type,&this->super_CompilerGLSL,c_00,false,false);
        CompilerGLSL::
        statement<char_const(&)[16],std::__cxx11::string,char_const(&)[21],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [16])"constant uint3 ",&local_170,
                   (char (*) [21])" [[maybe_unused]] = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,
                   (char (*) [2])0x4af37c);
        ::std::__cxx11::string::~string((string *)&type);
        ::std::__cxx11::string::~string((string *)&local_170);
        declared_structs._M_h._M_single_bucket._3_1_ = 1;
      }
      else if ((local_150->specialization & 1U) != 0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(local_150->super_IVariant).field_0xc);
        pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  ((undefined1 *)((long)&sc_name.field_2 + 8),this,pSVar5,0);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_150->super_IVariant).self)
        ;
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar2);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_150->super_IVariant).self)
        ;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (&constant_id,this,(ulong)uVar2);
        bVar1 = Options::supports_msl_version(&this->msl_options,1,2,0);
        if (bVar1) {
          local_1dc = (local_150->super_IVariant).self.id;
          bVar1 = Compiler::has_decoration((Compiler *)this,(ID)local_1dc,DecorationSpecId);
          if ((!bVar1) || ((local_150->is_used_as_array_length & 1U) != 0)) goto LAB_00270fe2;
          local_1e4 = (local_150->super_IVariant).self.id;
          local_1e0 = Compiler::get_decoration((Compiler *)this,(ID)local_1e4,DecorationSpecId);
          sVar6 = ::std::
                  unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                  ::count((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                           *)&__range1,&local_1e0);
          if (sVar6 == 0) {
            local_1ec = ::std::make_pair<unsigned_int&,spirv_cross::TypedID<(spirv_cross::Types)0>&>
                                  (&local_1e0,&(local_150->super_IVariant).self);
            ::std::
            unordered_map<unsigned_int,spirv_cross::TypedID<(spirv_cross::Types)3>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>>>
            ::insert<std::pair<unsigned_int,spirv_cross::TypedID<(spirv_cross::Types)0>>>
                      ((unordered_map<unsigned_int,spirv_cross::TypedID<(spirv_cross::Types)3>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spirv_cross::TypedID<(spirv_cross::Types)3>>>>
                        *)&__range1,&local_1ec);
          }
          pTVar7 = (TypedID *)
                   ::std::
                   unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                   ::operator[]((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                                 *)&__range1,&local_1e0);
          uVar2 = TypedID::operator_cast_to_unsigned_int(pTVar7);
          pSVar8 = Compiler::expression_type((Compiler *)this,uVar2);
          sc_tmp_name.field_2._12_4_ = pSVar8->basetype;
          pTVar7 = (TypedID *)
                   ::std::
                   unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                   ::operator[]((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                                 *)&__range1,&local_1e0);
          uVar2 = TypedID::operator_cast_to_unsigned_int(pTVar7);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&local_248,this,(ulong)uVar2,1);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_228,&local_248,"_tmp");
          ::std::__cxx11::string::~string((string *)&local_248);
          pTVar7 = (TypedID *)
                   ::std::
                   unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                   ::operator[]((unordered_map<unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::TypedID<(spirv_cross::Types)3>_>_>_>
                                 *)&__range1,&local_1e0);
          uVar2 = TypedID::operator_cast_to_unsigned_int(pTVar7);
          uVar4 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(local_150->super_IVariant).self);
          if (uVar2 == uVar4) {
            CompilerGLSL::
            statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[22],unsigned_int&,char_const(&)[5]>
                      (&this->super_CompilerGLSL,(char (*) [10])"constant ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&sc_name.field_2 + 8),(char (*) [2])0x4921b2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_228,(char (*) [22])0x49831f,&local_1e0,(char (*) [5])")]];");
          }
          CompilerGLSL::bitcast_expression
                    (&local_268,&this->super_CompilerGLSL,pSVar5,sc_tmp_name.field_2._12_4_,
                     (string *)local_228);
          CompilerGLSL::constant_expression_abi_cxx11_
                    (&local_288,&this->super_CompilerGLSL,local_150,false,false);
          CompilerGLSL::
          statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[33],std::__cxx11::string&,char_const(&)[5],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                    (&this->super_CompilerGLSL,(char (*) [10])"constant ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&sc_name.field_2 + 8),(char (*) [2])0x4921b2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &constant_id,(char (*) [33])" = is_function_constant_defined(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228,
                     (char (*) [5])0x4983a3,&local_268,(char (*) [4])0x4b9f13,&local_288,
                     (char (*) [2])0x4af37c);
          ::std::__cxx11::string::~string((string *)&local_288);
          ::std::__cxx11::string::~string((string *)&local_268);
          ::std::__cxx11::string::~string((string *)local_228);
        }
        else {
LAB_00270fe2:
          local_28c = (local_150->super_IVariant).self.id;
          bVar1 = Compiler::has_decoration((Compiler *)this,(ID)local_28c,DecorationSpecId);
          if (bVar1) {
            local_2b4 = (local_150->super_IVariant).self.id;
            uVar2 = Compiler::get_decoration((Compiler *)this,(ID)local_2b4,DecorationSpecId);
            CompilerGLSL::constant_value_macro_name_abi_cxx11_
                      (&local_2b0,&this->super_CompilerGLSL,uVar2);
            ::std::__cxx11::string::operator=
                      ((string *)&local_150->specialization_constant_macro_name,(string *)&local_2b0
                      );
            ::std::__cxx11::string::~string((string *)&local_2b0);
            CompilerGLSL::statement<char_const(&)[9],std::__cxx11::string&>
                      (&this->super_CompilerGLSL,(char (*) [9])"#ifndef ",
                       &local_150->specialization_constant_macro_name);
            ts_1 = &local_150->specialization_constant_macro_name;
            CompilerGLSL::constant_expression_abi_cxx11_
                      (&local_2d8,&this->super_CompilerGLSL,local_150,false,false);
            CompilerGLSL::
            statement<char_const(&)[9],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string>
                      (&this->super_CompilerGLSL,(char (*) [9])"#define ",ts_1,
                       (char (*) [2])0x4921b2,&local_2d8);
            ::std::__cxx11::string::~string((string *)&local_2d8);
            CompilerGLSL::statement<char_const(&)[7]>
                      (&this->super_CompilerGLSL,(char (*) [7])"#endif");
            CompilerGLSL::
            statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [10])"constant ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&sc_name.field_2 + 8),(char (*) [2])0x4921b2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &constant_id,(char (*) [4])0x4a41f0,
                       &local_150->specialization_constant_macro_name,(char (*) [2])0x4af37c);
          }
          else {
            CompilerGLSL::constant_expression_abi_cxx11_
                      ((string *)&c_1,&this->super_CompilerGLSL,local_150,false,false);
            CompilerGLSL::
            statement<char_const(&)[10],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                      (&this->super_CompilerGLSL,(char (*) [10])"constant ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&sc_name.field_2 + 8),(char (*) [2])0x4921b2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &constant_id,(char (*) [4])0x4a41f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c_1,
                       (char (*) [2])0x4af37c);
            ::std::__cxx11::string::~string((string *)&c_1);
          }
        }
        declared_structs._M_h._M_single_bucket._3_1_ = 1;
        ::std::__cxx11::string::~string((string *)&constant_id);
        ::std::__cxx11::string::~string((string *)(sc_name.field_2._M_local_buf + 8));
      }
    }
    else {
      TVar3 = Variant::get_type((Variant *)c);
      if (TVar3 == TypeConstantOp) {
        pSVar9 = Variant::get<spirv_cross::SPIRConstantOp>((Variant *)c);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar9->basetype);
        name.field_2._8_8_ = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar9->super_IVariant).self);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar2);
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar9->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                  (local_328,this,(ulong)uVar2,1);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                  (&local_348,this,name.field_2._8_8_,local_328,0);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x18])(&type_2,this,pSVar9);
        CompilerGLSL::
        statement<char_const(&)[10],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                  (&this->super_CompilerGLSL,(char (*) [10])"constant ",&local_348,
                   (char (*) [4])0x4a41f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type_2,
                   (char (*) [2])0x4af37c);
        ::std::__cxx11::string::~string((string *)&type_2);
        ::std::__cxx11::string::~string((string *)&local_348);
        declared_structs._M_h._M_single_bucket._3_1_ = 1;
        ::std::__cxx11::string::~string(local_328);
      }
      else {
        TVar3 = Variant::get_type((Variant *)c);
        if (TVar3 == TypeType) {
          pSStack_370 = Variant::get<spirv_cross::SPIRType>((Variant *)c);
          local_374 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(pSStack_370->super_IVariant).self);
          local_565 = 0;
          if (pSStack_370->basetype == Struct) {
            bVar1 = VectorView<unsigned_int>::empty
                              (&(pSStack_370->array).super_VectorView<unsigned_int>);
            local_565 = 0;
            if (bVar1) {
              local_565 = pSStack_370->pointer ^ 0xff;
            }
          }
          local_375 = local_565 & 1;
          IStack_37c.id = (pSStack_370->super_IVariant).self.id;
          bVar1 = Compiler::has_decoration((Compiler *)this,IStack_37c,DecorationBlock);
          local_567 = true;
          if (!bVar1) {
            local_380 = (pSStack_370->super_IVariant).self.id;
            local_567 = Compiler::has_decoration
                                  ((Compiler *)this,(ID)local_380,DecorationBufferBlock);
          }
          local_376 = local_567;
          local_569 = false;
          if (local_567 != false) {
            local_569 = Compiler::is_builtin_type((Compiler *)this,pSStack_370);
          }
          local_381 = local_569;
          local_56b = (local_375 & 1) != 0 && local_569 == false;
          local_382 = local_56b;
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_out_var_id);
          if (uVar2 != 0) {
            pSVar5 = get_stage_out_struct_type(this);
            uVar2 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar5->super_IVariant).self);
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_374);
            if (uVar2 == uVar4) {
              local_382 = 0;
            }
          }
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->patch_stage_out_var_id);
          if (uVar2 != 0) {
            pSVar5 = get_patch_stage_out_struct_type(this);
            uVar2 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar5->super_IVariant).self);
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_374);
            if (uVar2 == uVar4) {
              local_382 = 0;
            }
          }
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->stage_in_var_id);
          if (uVar2 != 0) {
            pSVar5 = get_stage_in_struct_type(this);
            uVar2 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar5->super_IVariant).self);
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_374);
            if (uVar2 == uVar4) {
              local_382 = 0;
            }
          }
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->patch_stage_in_var_id);
          if (uVar2 != 0) {
            pSVar5 = get_patch_stage_in_struct_type(this);
            uVar2 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSVar5->super_IVariant).self);
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_374);
            if (uVar2 == uVar4) {
              local_382 = 0;
            }
          }
          uVar2 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&this->stage_out_masked_builtin_type_id);
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_374);
          if (uVar2 == uVar4) {
            local_382 = 1;
          }
          bVar1 = false;
          if ((local_382 & 1) != 0) {
            local_388 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_374);
            sVar10 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&aligned_structs._M_h._M_single_bucket,&local_388);
            bVar1 = sVar10 == 0;
          }
          if (bVar1) {
            if ((declared_structs._M_h._M_single_bucket._3_1_ & 1) != 0) {
              CompilerGLSL::statement<char_const(&)[1]>
                        (&this->super_CompilerGLSL,(char (*) [1])0x48ca95);
            }
            declared_structs._M_h._M_single_bucket._3_1_ = 0;
            local_38c = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_374);
            pVar11 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                               *)&aligned_structs._M_h._M_single_bucket,&local_38c);
            undef = (SPIRUndef *)pVar11.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
            local_398 = pVar11.second;
            uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_374);
            bVar1 = Compiler::has_extended_decoration
                              ((Compiler *)this,uVar2,SPIRVCrossDecorationBufferBlockRepacked);
            if (bVar1) {
              align_struct(this,pSStack_370,
                           (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)local_a0);
            }
            uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_374);
            pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
            CompilerGLSL::emit_struct(&this->super_CompilerGLSL,pSVar5);
          }
        }
        else {
          TVar3 = Variant::get_type((Variant *)c);
          if (TVar3 == TypeUndef) {
            type_3 = (SPIRType *)Variant::get<spirv_cross::SPIRUndef>((Variant *)c);
            uVar2 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(type_3->super_IVariant).field_0xc);
            pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
            local_3b0 = pSVar5;
            if (pSVar5->basetype == Void) {
              local_3b4 = 1;
              goto LAB_00271ce9;
            }
            uVar2 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(type_3->super_IVariant).self);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_418,this,(ulong)uVar2,1);
            TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_3->super_IVariant).self);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                      (&local_3f8,this,pSVar5,local_418);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_438,"constant",&local_439);
            inject_top_level_storage_qualifier(&local_3d8,&local_3f8,&local_438);
            CompilerGLSL::statement<std::__cxx11::string,char_const(&)[7]>
                      (&this->super_CompilerGLSL,&local_3d8,(char (*) [7])" = {};");
            ::std::__cxx11::string::~string((string *)&local_3d8);
            ::std::__cxx11::string::~string((string *)&local_438);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_439);
            ::std::__cxx11::string::~string((string *)&local_3f8);
            ::std::__cxx11::string::~string(local_418);
            declared_structs._M_h._M_single_bucket._3_1_ = 1;
          }
        }
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

void CompilerMSL::emit_specialization_constants_and_structs()
{
	SpecializationConstant wg_x, wg_y, wg_z;
	ID workgroup_size_id = get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);
	bool emitted = false;

	unordered_set<uint32_t> declared_structs;
	unordered_set<uint32_t> aligned_structs;

	// First, we need to deal with scalar block layout.
	// It is possible that a struct may have to be placed at an alignment which does not match the innate alignment of the struct itself.
	// In that case, if such a case exists for a struct, we must force that all elements of the struct become packed_ types.
	// This makes the struct alignment as small as physically possible.
	// When we actually align the struct later, we can insert padding as necessary to make the packed members behave like normally aligned types.
	ir.for_each_typed_id<SPIRType>([&](uint32_t type_id, const SPIRType &type) {
		if (type.basetype == SPIRType::Struct &&
		    has_extended_decoration(type_id, SPIRVCrossDecorationBufferBlockRepacked))
			mark_scalar_layout_structs(type);
	});

	bool builtin_block_type_is_required = false;
	// Very special case. If gl_PerVertex is initialized as an array (tessellation)
	// we have to potentially emit the gl_PerVertex struct type so that we can emit a constant LUT.
	ir.for_each_typed_id<SPIRConstant>([&](uint32_t, SPIRConstant &c) {
		auto &type = this->get<SPIRType>(c.constant_type);
		if (is_array(type) && has_decoration(type.self, DecorationBlock) && is_builtin_type(type))
			builtin_block_type_is_required = true;
	});

	// Very particular use of the soft loop lock.
	// align_struct may need to create custom types on the fly, but we don't care about
	// these types for purpose of iterating over them in ir.ids_for_type and friends.
	auto loop_lock = ir.create_loop_soft_lock();

	// Physical storage buffer pointers can have cyclical references,
	// so emit forward declarations of them before other structs.
	// Ignore type_id because we want the underlying struct type from the pointer.
	ir.for_each_typed_id<SPIRType>([&](uint32_t /* type_id */, const SPIRType &type) {
		if (type.basetype == SPIRType::Struct &&
			type.pointer && type.storage == StorageClassPhysicalStorageBuffer &&
			declared_structs.count(type.self) == 0)
		{
			statement("struct ", to_name(type.self), ";");
			declared_structs.insert(type.self);
			emitted = true;
		}
	});
	if (emitted)
		statement("");

	emitted = false;
	declared_structs.clear();

	// It is possible to have multiple spec constants that use the same spec constant ID.
	// The most common cause of this is defining spec constants in GLSL while also declaring
	// the workgroup size to use those spec constants. But, Metal forbids declaring more than
	// one variable with the same function constant ID.
	// In this case, we must only declare one variable with the [[function_constant(id)]]
	// attribute, and use its initializer to initialize all the spec constants with
	// that ID.
	std::unordered_map<uint32_t, ConstantID> unique_func_constants;

	for (auto &id_ : ir.ids_for_constant_undef_or_type)
	{
		auto &id = ir.ids[id_];

		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();

			if (c.self == workgroup_size_id)
			{
				// TODO: This can be expressed as a [[threads_per_threadgroup]] input semantic, but we need to know
				// the work group size at compile time in SPIR-V, and [[threads_per_threadgroup]] would need to be passed around as a global.
				// The work group size may be a specialization constant.
				statement("constant uint3 ", builtin_to_glsl(BuiltInWorkgroupSize, StorageClassWorkgroup),
				          " [[maybe_unused]] = ", constant_expression(get<SPIRConstant>(workgroup_size_id)), ";");
				emitted = true;
			}
			else if (c.specialization)
			{
				auto &type = get<SPIRType>(c.constant_type);
				string sc_type_name = type_to_glsl(type);
				add_resource_name(c.self);
				string sc_name = to_name(c.self);

				// Function constants are only supported in MSL 1.2 and later.
				// If we don't support it just declare the "default" directly.
				// This "default" value can be overridden to the true specialization constant by the API user.
				// Specialization constants which are used as array length expressions cannot be function constants in MSL,
				// so just fall back to macros.
				if (msl_options.supports_msl_version(1, 2) && has_decoration(c.self, DecorationSpecId) &&
				    !c.is_used_as_array_length)
				{
					// Only scalar, non-composite values can be function constants.
					uint32_t constant_id = get_decoration(c.self, DecorationSpecId);
					if (!unique_func_constants.count(constant_id))
						unique_func_constants.insert(make_pair(constant_id, c.self));
					SPIRType::BaseType sc_tmp_type = expression_type(unique_func_constants[constant_id]).basetype;
					string sc_tmp_name = to_name(unique_func_constants[constant_id]) + "_tmp";
					if (unique_func_constants[constant_id] == c.self)
						statement("constant ", sc_type_name, " ", sc_tmp_name, " [[function_constant(", constant_id,
						          ")]];");
					statement("constant ", sc_type_name, " ", sc_name, " = is_function_constant_defined(", sc_tmp_name,
					          ") ? ", bitcast_expression(type, sc_tmp_type, sc_tmp_name), " : ", constant_expression(c),
					          ";");
				}
				else if (has_decoration(c.self, DecorationSpecId))
				{
					// Fallback to macro overrides.
					c.specialization_constant_macro_name =
					    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));

					statement("#ifndef ", c.specialization_constant_macro_name);
					statement("#define ", c.specialization_constant_macro_name, " ", constant_expression(c));
					statement("#endif");
					statement("constant ", sc_type_name, " ", sc_name, " = ", c.specialization_constant_macro_name,
					          ";");
				}
				else
				{
					// Composite specialization constants must be built from other specialization constants.
					statement("constant ", sc_type_name, " ", sc_name, " = ", constant_expression(c), ";");
				}
				emitted = true;
			}
		}
		else if (id.get_type() == TypeConstantOp)
		{
			auto &c = id.get<SPIRConstantOp>();
			auto &type = get<SPIRType>(c.basetype);
			add_resource_name(c.self);
			auto name = to_name(c.self);
			statement("constant ", variable_decl(type, name), " = ", constant_op_expression(c), ";");
			emitted = true;
		}
		else if (id.get_type() == TypeType)
		{
			// Output non-builtin interface structs. These include local function structs
			// and structs nested within uniform and read-write buffers.
			auto &type = id.get<SPIRType>();
			TypeID type_id = type.self;

			bool is_struct = (type.basetype == SPIRType::Struct) && type.array.empty() && !type.pointer;
			bool is_block =
			    has_decoration(type.self, DecorationBlock) || has_decoration(type.self, DecorationBufferBlock);

			bool is_builtin_block = is_block && is_builtin_type(type);
			bool is_declarable_struct = is_struct && (!is_builtin_block || builtin_block_type_is_required);

			// We'll declare this later.
			if (stage_out_var_id && get_stage_out_struct_type().self == type_id)
				is_declarable_struct = false;
			if (patch_stage_out_var_id && get_patch_stage_out_struct_type().self == type_id)
				is_declarable_struct = false;
			if (stage_in_var_id && get_stage_in_struct_type().self == type_id)
				is_declarable_struct = false;
			if (patch_stage_in_var_id && get_patch_stage_in_struct_type().self == type_id)
				is_declarable_struct = false;

			// Special case. Declare builtin struct anyways if we need to emit a threadgroup version of it.
			if (stage_out_masked_builtin_type_id == type_id)
				is_declarable_struct = true;

			// Align and emit declarable structs...but avoid declaring each more than once.
			if (is_declarable_struct && declared_structs.count(type_id) == 0)
			{
				if (emitted)
					statement("");
				emitted = false;

				declared_structs.insert(type_id);

				if (has_extended_decoration(type_id, SPIRVCrossDecorationBufferBlockRepacked))
					align_struct(type, aligned_structs);

				// Make sure we declare the underlying struct type, and not the "decorated" type with pointers, etc.
				emit_struct(get<SPIRType>(type_id));
			}
		}
		else if (id.get_type() == TypeUndef)
		{
			auto &undef = id.get<SPIRUndef>();
			auto &type = get<SPIRType>(undef.basetype);
			// OpUndef can be void for some reason ...
			if (type.basetype == SPIRType::Void)
				return;

			// Undefined global memory is not allowed in MSL.
			// Declare constant and init to zeros. Use {}, as global constructors can break Metal.
			statement(
			    inject_top_level_storage_qualifier(variable_decl(type, to_name(undef.self), undef.self), "constant"),
			    " = {};");
			emitted = true;
		}
	}

	if (emitted)
		statement("");
}